

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ssize_t __thiscall hdc::Parser::read(Parser *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pcVar1;
  TokenKind TVar2;
  SourceFile *pSVar3;
  Import *import;
  Class *klass;
  Def *def;
  GlobalVariable *var;
  GlobalConstant *var_00;
  Struct *s;
  undefined4 in_register_00000034;
  string *path;
  Lex lex;
  string local_1d8;
  vector<hdc::Token,_std::allocator<hdc::Token>_> local_1b8;
  vector<hdc::Token,_std::allocator<hdc::Token>_> local_198;
  Lex local_178;
  
  path = (string *)CONCAT44(in_register_00000034,__fd);
  Lex::Lex(&local_178);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,pcVar1 + path->_M_string_length);
  Lex::getTokens(&local_1b8,&local_178,&local_1d8);
  local_198.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1b8.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_198.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_198.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1b8.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1b8.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b8.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::~vector(&local_198);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::~vector(&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  pSVar3 = (SourceFile *)operator_new(0xd0);
  SourceFile::SourceFile(pSVar3,path);
  this->file = pSVar3;
  (this->current_token)._M_current =
       (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_assign((string *)&this->filePath);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              TVar2 = Token::getKind((this->current_token)._M_current);
              if (TVar2 != TK_IMPORT) break;
              pSVar3 = this->file;
              import = parse_import(this);
              SourceFile::addImport(pSVar3,import);
            }
            TVar2 = Token::getKind((this->current_token)._M_current);
            if (TVar2 != TK_DEF) break;
            pSVar3 = this->file;
            def = parse_def(this);
            SourceFile::addDef(pSVar3,def);
          }
          TVar2 = Token::getKind((this->current_token)._M_current);
          if (TVar2 != TK_CLASS) break;
          pSVar3 = this->file;
          klass = parse_class(this);
          SourceFile::addClass(pSVar3,klass);
        }
        TVar2 = Token::getKind((this->current_token)._M_current);
        if (TVar2 != TK_VAR) break;
        pSVar3 = this->file;
        var = parse_global_variable(this);
        SourceFile::addGlobalVariable(pSVar3,var);
      }
      TVar2 = Token::getKind((this->current_token)._M_current);
      if (TVar2 != TK_CONSTANT) break;
      pSVar3 = this->file;
      var_00 = parse_global_constant(this);
      SourceFile::addGlobalConstant(pSVar3,var_00);
    }
    TVar2 = Token::getKind((this->current_token)._M_current);
    pSVar3 = this->file;
    if (TVar2 != TK_STRUCT) break;
    s = parse_struct(this);
    SourceFile::addStruct(pSVar3,s);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
  ::~_Rb_tree(&local_178.operatorMap._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
  ::~_Rb_tree(&local_178.keywordsMap._M_t);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&local_178.indentationStack);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::~vector(&local_178.tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.buffer._M_dataplus._M_p != &local_178.buffer.field_2) {
    operator_delete(local_178.buffer._M_dataplus._M_p);
  }
  std::_Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>::~_Deque_base
            ((_Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_> *)&local_178.blockStack);
  return (ssize_t)pSVar3;
}

Assistant:

SourceFile* Parser::read(std::string path) {
    Lex lex;

    tokens = lex.getTokens(path);
    file = new SourceFile(path);
    current_token = tokens.begin();
    filePath = path;

    while (true) { 
        if (lookahead(TK_IMPORT)) {
            file->addImport(parse_import());
        } else if (lookahead(TK_DEF)) {
            file->addDef(parse_def());
        } else if (lookahead(TK_CLASS)) {
            file->addClass(parse_class());
        } else if (lookahead(TK_VAR)) {
            file->addGlobalVariable(parse_global_variable());
        } else if (lookahead(TK_CONSTANT)) {
            file->addGlobalConstant(parse_global_constant());
        } else if (lookahead(TK_STRUCT)) {
            file->addStruct(parse_struct());
        } else {
            break;
        }
    }

    return file;
}